

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::ErrorsTest::testIndexedQueriesForInvalidBindingPoint
          (ErrorsTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_9b8;
  MessageBuilder local_9a8;
  MessageBuilder local_828;
  GetNameFunc local_6a8;
  int local_6a0;
  Enum<int,_2UL> local_698;
  MessageBuilder local_688;
  GetNameFunc local_508;
  int local_500;
  Enum<int,_2UL> local_4f8;
  MessageBuilder local_4e8;
  MessageBuilder local_368;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  byte local_35;
  int local_34;
  bool is_ok;
  long lStack_30;
  GLenum error;
  GLint64 buffer64;
  GLuint local_20;
  GLint buffer;
  GLuint xfb;
  GLint max_transform_feedback_buffers;
  Functions *gl;
  ErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _xfb = CONCAT44(extraout_var,iVar1);
  buffer = 4;
  (**(code **)(_xfb + 0x868))(0x8e70,&buffer);
  dVar2 = (**(code **)(_xfb + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x5b6);
  local_20 = 0;
  (**(code **)(_xfb + 0x408))(1,&local_20);
  dVar2 = (**(code **)(_xfb + 0x800))();
  glu::checkError(dVar2,"glCreateTransformFeedbacks have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x5bc);
  buffer64._4_4_ = 0x4cb2f;
  lStack_30 = 0x4cb2f;
  local_34 = 0;
  local_35 = 1;
  (*this->m_gl_getTransformFeedbacki_v)(local_20,0x8c8f,buffer,(GLint *)((long)&buffer64 + 4));
  local_34 = (**(code **)(_xfb + 0x800))();
  if (local_34 != 0x501) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_1b8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [110])
                        "glGetTransformFeedbacki_v called with invalid index had been expected to generate GL_INVALID_VALUE. However, "
                       );
    EVar7 = glu::getErrorStr(local_34);
    local_1e8 = EVar7.m_getName;
    local_1e0 = EVar7.m_value;
    local_1d8[0].m_getName = local_1e8;
    local_1d8[0].m_value = local_1e0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1d8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])" was captured.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    local_35 = 0;
  }
  if (buffer64._4_4_ != 0x4cb2f) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_368,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_368,
                        (char (*) [102])
                        "glGetTransformFeedbacki_v called with invalid index had been expected not to change the given buffer."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_368);
    local_35 = 0;
  }
  while (local_34 = (**(code **)(_xfb + 0x800))(), local_34 != 0) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_4e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_4e8,
                        (char (*) [130])
                        "Warning! glGetTransformFeedbacki_v called with invalid index has unexpectedly generated more than one error, The next error was  "
                       );
    EVar7 = glu::getErrorStr(local_34);
    local_508 = EVar7.m_getName;
    local_500 = EVar7.m_value;
    local_4f8.m_getName = local_508;
    local_4f8.m_value = local_500;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_4f8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4e8);
  }
  (*this->m_gl_getTransformFeedbacki64_v)(local_20,0x8c84,buffer,&stack0xffffffffffffffd0);
  local_34 = (**(code **)(_xfb + 0x800))();
  if (local_34 != 0x501) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_688,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_688,
                        (char (*) [112])
                        "glGetTransformFeedbacki64_v called with invalid index had been expected to generate GL_INVALID_VALUE. However, "
                       );
    EVar7 = glu::getErrorStr(local_34);
    local_6a8 = EVar7.m_getName;
    local_6a0 = EVar7.m_value;
    local_698.m_getName = local_6a8;
    local_698.m_value = local_6a0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_698);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])" was captured.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_688);
    local_35 = 0;
  }
  if (lStack_30 != 0x4cb2f) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_828,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_828,
                        (char (*) [104])
                        "glGetTransformFeedbacki64_v called with invalid index had been expected not to change the given buffer."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_828);
    local_35 = 0;
  }
  while (local_34 = (**(code **)(_xfb + 0x800))(), local_34 != 0) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_9a8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_9a8,
                        (char (*) [132])
                        "Warning! glGetTransformFeedbacki64_v called with invalid index has unexpectedly generated more than one error, The next error was  "
                       );
    EVar7 = glu::getErrorStr(local_34);
    local_9b8.m_getName = EVar7.m_getName;
    local_9b8.m_value = EVar7.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_9b8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_9a8);
  }
  (**(code **)(_xfb + 0x488))(1,&local_20);
  dVar2 = (**(code **)(_xfb + 0x800))();
  glu::checkError(dVar2,"glDeleteTransformFeedbacks have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x608);
  return (bool)(local_35 & 1);
}

Assistant:

bool ErrorsTest::testIndexedQueriesForInvalidBindingPoint()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generating invalid index. */
	glw::GLint max_transform_feedback_buffers =
		4; /* Default limit is 4 - OpenGL 4.5 Core Specification, Table 23.72: Implementation Dependent Transform Feedback Limits. */

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_BUFFERS, &max_transform_feedback_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv have failed");

	/* Creating XFB object. */
	glw::GLuint xfb = 0;

	gl.createTransformFeedbacks(1, &xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTransformFeedbacks have failed");

	/* Dummy storage. */
	glw::GLint   buffer   = 314159;
	glw::GLint64 buffer64 = 314159;

	/* Error variable. */
	glw::GLenum error = 0;

	/* Default result. */
	bool is_ok = true;

	/* Test of GetTransformFeedbacki_v. */
	m_gl_getTransformFeedbacki_v(xfb, GL_TRANSFORM_FEEDBACK_BUFFER_BINDING, max_transform_feedback_buffers, &buffer);

	if (GL_INVALID_VALUE != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki_v called with invalid index had been expected "
											   "to generate GL_INVALID_VALUE. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	if (314159 != buffer)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "glGetTransformFeedbacki_v called with invalid index had been expected not to change the given buffer."
			<< tcu::TestLog::EndMessage;

		is_ok = false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbacki_v called with invalid index has "
											   "unexpectedly generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	/* Test of GetTransformFeedbacki64_v. */
	m_gl_getTransformFeedbacki64_v(xfb, GL_TRANSFORM_FEEDBACK_BUFFER_START, max_transform_feedback_buffers, &buffer64);

	if (GL_INVALID_VALUE != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki64_v called with invalid index had been "
											   "expected to generate GL_INVALID_VALUE. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	if (314159 != buffer64)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "glGetTransformFeedbacki64_v called with invalid index had been expected not to change the given buffer."
			<< tcu::TestLog::EndMessage;

		is_ok = false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbacki64_v called with invalid index has "
											   "unexpectedly generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	/* Clean-up. */
	gl.deleteTransformFeedbacks(1, &xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTransformFeedbacks have failed");

	return is_ok;
}